

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_p.h
# Opt level: O0

QStorageInfo QStorageInfoPrivate::root(void)

{
  QExplicitlySharedDataPointer<QStorageInfoPrivate> in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff78;
  QExplicitlySharedDataPointer<QStorageInfoPrivate> this;
  QString *in_stack_ffffffffffffff98;
  QStorageInfo *in_stack_ffffffffffffffa0;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this.d.ptr = in_RDI.d.ptr;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"/",1);
  QString::QString((QString *)this.d.ptr,in_stack_ffffffffffffff78);
  QStorageInfo::QStorageInfo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QString::~QString((QString *)0x2f6212);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this.d.ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QStorageInfoPrivate>)
           (QExplicitlySharedDataPointer<QStorageInfoPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QStorageInfo root()
    {
#ifdef Q_OS_WIN
        return QStorageInfo(QDir::fromNativeSeparators(QFile::decodeName(qgetenv("SystemDrive"))));
#else
        return QStorageInfo(QStringLiteral("/"));
#endif
    }